

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.hpp
# Opt level: O0

void __thiscall lightconf::group::set_key(group *this,string *key,value *val)

{
  value *rhs;
  bool bVar1;
  mapped_type *this_00;
  _Self local_30;
  _Self local_28;
  value *local_20;
  value *val_local;
  string *key_local;
  group *this_local;
  
  local_20 = val;
  val_local = (value *)key;
  key_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
       ::find(&this->values_,key);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
       ::end(&this->values_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->order_,(value_type *)val_local);
  }
  rhs = local_20;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
            ::operator[](&this->values_,(key_type *)val_local);
  value::operator=(this_00,rhs);
  return;
}

Assistant:

inline void group::set_key(const std::string& key, const value& val) {
    if (values_.find(key) == values_.end()) {
        order_.push_back(key);
    }
    values_[key] = val;
}